

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslconfiguration.cpp
# Opt level: O0

bool __thiscall QSslConfiguration::operator==(QSslConfiguration *this,QSslConfiguration *other)

{
  SslProtocol SVar1;
  PeerVerifyMode PVar2;
  QFlags<QSsl::SslOption> lhs;
  long lVar3;
  bool bVar4;
  compare_eq_result_container<QList<QSslCertificate>,_QSslCertificate> cVar5;
  compare_eq_result_container<QList<QSslCipher>,_QSslCipher> cVar6;
  compare_eq_result_container<QList<QSslEllipticCurve>,_QSslEllipticCurve> cVar7;
  compare_eq_result_container<QList<QByteArray>,_QByteArray> cVar8;
  uint uVar9;
  QSslConfigurationPrivate *pQVar10;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  NextProtocolNegotiationStatus NVar11;
  QByteArray *in_stack_ffffffffffffff30;
  QByteArray *lhs_00;
  QSslCipher *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  int iVar12;
  QSslKey *in_stack_ffffffffffffff48;
  QList<QSslCipher> *in_stack_ffffffffffffff50;
  QMap<QByteArray,_QVariant> *other_00;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  int iVar13;
  bool local_31;
  bool local_11;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  bVar4 = ::operator==((QSharedDataPointer<QSslConfigurationPrivate> *)
                       CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                       (QSharedDataPointer<QSslConfigurationPrivate> *)
                       CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  if (bVar4) {
    local_11 = true;
  }
  else {
    QSharedDataPointer<QSslConfigurationPrivate>::operator->
              ((QSharedDataPointer<QSslConfigurationPrivate> *)0x38ca69);
    QSharedDataPointer<QSslConfigurationPrivate>::operator->
              ((QSharedDataPointer<QSslConfigurationPrivate> *)0x38ca82);
    bVar4 = QSslCertificate::operator==
                      ((QSslCertificate *)
                       CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                       (QSslCertificate *)
                       CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    local_31 = false;
    if (bVar4) {
      QSharedDataPointer<QSslConfigurationPrivate>::operator->
                ((QSharedDataPointer<QSslConfigurationPrivate> *)0x38cab8);
      QSharedDataPointer<QSslConfigurationPrivate>::operator->
                ((QSharedDataPointer<QSslConfigurationPrivate> *)0x38cad1);
      cVar5 = QList<QSslCertificate>::operator==
                        ((QList<QSslCertificate> *)
                         CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                         (QList<QSslCertificate> *)in_stack_ffffffffffffff50);
      local_31 = false;
      if (cVar5) {
        QSharedDataPointer<QSslConfigurationPrivate>::operator->
                  ((QSharedDataPointer<QSslConfigurationPrivate> *)0x38cb07);
        QSharedDataPointer<QSslConfigurationPrivate>::operator->
                  ((QSharedDataPointer<QSslConfigurationPrivate> *)0x38cb20);
        cVar5 = QList<QSslCertificate>::operator==
                          ((QList<QSslCertificate> *)
                           CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                           (QList<QSslCertificate> *)in_stack_ffffffffffffff50);
        local_31 = false;
        if (cVar5) {
          QSharedDataPointer<QSslConfigurationPrivate>::operator->
                    ((QSharedDataPointer<QSslConfigurationPrivate> *)0x38cb56);
          QSharedDataPointer<QSslConfigurationPrivate>::operator->
                    ((QSharedDataPointer<QSslConfigurationPrivate> *)0x38cb6f);
          bVar4 = QSslKey::operator==((QSslKey *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48
                                     );
          local_31 = false;
          if (bVar4) {
            QSharedDataPointer<QSslConfigurationPrivate>::operator->
                      ((QSharedDataPointer<QSslConfigurationPrivate> *)0x38cba5);
            QSharedDataPointer<QSslConfigurationPrivate>::operator->
                      ((QSharedDataPointer<QSslConfigurationPrivate> *)0x38cbbe);
            bVar4 = QSslCipher::operator==
                              ((QSslCipher *)
                               CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                               in_stack_ffffffffffffff38);
            local_31 = false;
            if (bVar4) {
              pQVar10 = QSharedDataPointer<QSslConfigurationPrivate>::operator->
                                  ((QSharedDataPointer<QSslConfigurationPrivate> *)0x38cbf4);
              SVar1 = pQVar10->sessionProtocol;
              pQVar10 = QSharedDataPointer<QSslConfigurationPrivate>::operator->
                                  ((QSharedDataPointer<QSslConfigurationPrivate> *)0x38cc0b);
              local_31 = false;
              if (SVar1 == pQVar10->sessionProtocol) {
                QSharedDataPointer<QSslConfigurationPrivate>::operator->
                          ((QSharedDataPointer<QSslConfigurationPrivate> *)0x38cc34);
                QSharedDataPointer<QSslConfigurationPrivate>::operator->
                          ((QSharedDataPointer<QSslConfigurationPrivate> *)0x38cc4c);
                bVar4 = ::operator==(in_stack_ffffffffffffff30,
                                     (QByteArray *)
                                     CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
                local_31 = false;
                if (bVar4) {
                  QSharedDataPointer<QSslConfigurationPrivate>::operator->
                            ((QSharedDataPointer<QSslConfigurationPrivate> *)0x38cc82);
                  QSharedDataPointer<QSslConfigurationPrivate>::operator->
                            ((QSharedDataPointer<QSslConfigurationPrivate> *)0x38cc98);
                  cVar6 = QList<QSslCipher>::operator==
                                    ((QList<QSslCipher> *)
                                     CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                                     in_stack_ffffffffffffff50);
                  local_31 = false;
                  if (cVar6) {
                    QSharedDataPointer<QSslConfigurationPrivate>::operator->
                              ((QSharedDataPointer<QSslConfigurationPrivate> *)0x38cccb);
                    QSharedDataPointer<QSslConfigurationPrivate>::operator->
                              ((QSharedDataPointer<QSslConfigurationPrivate> *)0x38cce3);
                    cVar7 = QList<QSslEllipticCurve>::operator==
                                      ((QList<QSslEllipticCurve> *)
                                       CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58)
                                       ,(QList<QSslEllipticCurve> *)in_stack_ffffffffffffff50);
                    local_31 = false;
                    if (cVar7) {
                      QSharedDataPointer<QSslConfigurationPrivate>::operator->
                                ((QSharedDataPointer<QSslConfigurationPrivate> *)0x38cd19);
                      QSharedDataPointer<QSslConfigurationPrivate>::operator->
                                ((QSharedDataPointer<QSslConfigurationPrivate> *)0x38cd31);
                      bVar4 = QSslKey::operator==((QSslKey *)in_stack_ffffffffffffff50,
                                                  in_stack_ffffffffffffff48);
                      local_31 = false;
                      if (bVar4) {
                        QSharedDataPointer<QSslConfigurationPrivate>::operator->
                                  ((QSharedDataPointer<QSslConfigurationPrivate> *)0x38cd67);
                        QSharedDataPointer<QSslConfigurationPrivate>::operator->
                                  ((QSharedDataPointer<QSslConfigurationPrivate> *)0x38cd7f);
                        bVar4 = ::operator==((QSslDiffieHellmanParameters *)
                                             CONCAT44(in_stack_ffffffffffffff24,
                                                      in_stack_ffffffffffffff20),
                                             (QSslDiffieHellmanParameters *)
                                             CONCAT44(in_stack_ffffffffffffff1c,
                                                      in_stack_ffffffffffffff18));
                        local_31 = false;
                        if (bVar4) {
                          QSharedDataPointer<QSslConfigurationPrivate>::operator->
                                    ((QSharedDataPointer<QSslConfigurationPrivate> *)0x38cdb5);
                          QSharedDataPointer<QSslConfigurationPrivate>::operator->
                                    ((QSharedDataPointer<QSslConfigurationPrivate> *)0x38cdcb);
                          cVar5 = QList<QSslCertificate>::operator==
                                            ((QList<QSslCertificate> *)
                                             CONCAT44(in_stack_ffffffffffffff5c,
                                                      in_stack_ffffffffffffff58),
                                             (QList<QSslCertificate> *)in_stack_ffffffffffffff50);
                          local_31 = false;
                          if (cVar5) {
                            pQVar10 = QSharedDataPointer<QSslConfigurationPrivate>::operator->
                                                ((QSharedDataPointer<QSslConfigurationPrivate> *)
                                                 0x38cdfe);
                            SVar1 = pQVar10->protocol;
                            pQVar10 = QSharedDataPointer<QSslConfigurationPrivate>::operator->
                                                ((QSharedDataPointer<QSslConfigurationPrivate> *)
                                                 0x38ce15);
                            local_31 = false;
                            if (SVar1 == pQVar10->protocol) {
                              pQVar10 = QSharedDataPointer<QSslConfigurationPrivate>::operator->
                                                  ((QSharedDataPointer<QSslConfigurationPrivate> *)
                                                   0x38ce3e);
                              PVar2 = pQVar10->peerVerifyMode;
                              pQVar10 = QSharedDataPointer<QSslConfigurationPrivate>::operator->
                                                  ((QSharedDataPointer<QSslConfigurationPrivate> *)
                                                   0x38ce55);
                              local_31 = false;
                              if (PVar2 == pQVar10->peerVerifyMode) {
                                pQVar10 = QSharedDataPointer<QSslConfigurationPrivate>::operator->
                                                    ((QSharedDataPointer<QSslConfigurationPrivate> *
                                                     )0x38ce7e);
                                iVar13 = pQVar10->peerVerifyDepth;
                                pQVar10 = QSharedDataPointer<QSslConfigurationPrivate>::operator->
                                                    ((QSharedDataPointer<QSslConfigurationPrivate> *
                                                     )0x38ce95);
                                local_31 = false;
                                if (iVar13 == pQVar10->peerVerifyDepth) {
                                  pQVar10 = QSharedDataPointer<QSslConfigurationPrivate>::operator->
                                                      ((QSharedDataPointer<QSslConfigurationPrivate>
                                                        *)0x38cebe);
                                  uVar9 = (uint)(pQVar10->allowRootCertOnDemandLoading & 1);
                                  pQVar10 = QSharedDataPointer<QSslConfigurationPrivate>::operator->
                                                      ((QSharedDataPointer<QSslConfigurationPrivate>
                                                        *)0x38ceda);
                                  local_31 = false;
                                  if (uVar9 == (pQVar10->allowRootCertOnDemandLoading & 1)) {
                                    pQVar10 = QSharedDataPointer<QSslConfigurationPrivate>::
                                              operator->((
                                                  QSharedDataPointer<QSslConfigurationPrivate> *)
                                                  0x38cf07);
                                    other_00 = &pQVar10->backendConfig;
                                    QSharedDataPointer<QSslConfigurationPrivate>::operator->
                                              ((QSharedDataPointer<QSslConfigurationPrivate> *)
                                               0x38cf1f);
                                    bVar4 = operator==<QByteArray,_QVariant,_true>
                                                      ((QMap<QByteArray,_QVariant> *)
                                                       CONCAT44(in_stack_ffffffffffffff24,
                                                                in_stack_ffffffffffffff20),
                                                       (QMap<QByteArray,_QVariant> *)
                                                       CONCAT44(in_stack_ffffffffffffff1c,
                                                                in_stack_ffffffffffffff18));
                                    local_31 = false;
                                    if (bVar4) {
                                      pQVar10 = QSharedDataPointer<QSslConfigurationPrivate>::
                                                operator->((
                                                  QSharedDataPointer<QSslConfigurationPrivate> *)
                                                  0x38cf55);
                                      lhs.super_QFlagsStorageHelper<QSsl::SslOption,_4>.
                                      super_QFlagsStorage<QSsl::SslOption>.i =
                                           (QFlagsStorageHelper<QSsl::SslOption,_4>)
                                           (pQVar10->sslOptions).
                                           super_QFlagsStorageHelper<QSsl::SslOption,_4>.
                                           super_QFlagsStorage<QSsl::SslOption>.i;
                                      pQVar10 = QSharedDataPointer<QSslConfigurationPrivate>::
                                                operator->((
                                                  QSharedDataPointer<QSslConfigurationPrivate> *)
                                                  0x38cf6f);
                                      bVar4 = ::operator==(lhs,(QFlags<QSsl::SslOption>)
                                                               (pQVar10->sslOptions).
                                                                                                                              
                                                  super_QFlagsStorageHelper<QSsl::SslOption,_4>.
                                                  super_QFlagsStorage<QSsl::SslOption>.i);
                                      local_31 = false;
                                      if (bVar4) {
                                        QSharedDataPointer<QSslConfigurationPrivate>::operator->
                                                  ((QSharedDataPointer<QSslConfigurationPrivate> *)
                                                   0x38cfb1);
                                        QSharedDataPointer<QSslConfigurationPrivate>::operator->
                                                  ((QSharedDataPointer<QSslConfigurationPrivate> *)
                                                   0x38cfc9);
                                        bVar4 = ::operator==(in_stack_ffffffffffffff30,
                                                             (QByteArray *)
                                                             CONCAT44(in_stack_ffffffffffffff2c,
                                                                      in_stack_ffffffffffffff28));
                                        local_31 = false;
                                        if (bVar4) {
                                          pQVar10 = QSharedDataPointer<QSslConfigurationPrivate>::
                                                    operator->((
                                                  QSharedDataPointer<QSslConfigurationPrivate> *)
                                                  0x38cfff);
                                          iVar12 = pQVar10->sslSessionTicketLifeTimeHint;
                                          pQVar10 = QSharedDataPointer<QSslConfigurationPrivate>::
                                                    operator->((
                                                  QSharedDataPointer<QSslConfigurationPrivate> *)
                                                  0x38d016);
                                          local_31 = false;
                                          if (iVar12 == pQVar10->sslSessionTicketLifeTimeHint) {
                                            QSharedDataPointer<QSslConfigurationPrivate>::operator->
                                                      ((QSharedDataPointer<QSslConfigurationPrivate>
                                                        *)0x38d03f);
                                            QSharedDataPointer<QSslConfigurationPrivate>::operator->
                                                      ((QSharedDataPointer<QSslConfigurationPrivate>
                                                        *)0x38d057);
                                            cVar8 = QList<QByteArray>::operator==
                                                              ((QList<QByteArray> *)
                                                               CONCAT44(iVar13,uVar9),
                                                               (QList<QByteArray> *)other_00);
                                            local_31 = false;
                                            if (cVar8) {
                                              pQVar10 = QSharedDataPointer<QSslConfigurationPrivate>
                                                        ::operator->((
                                                  QSharedDataPointer<QSslConfigurationPrivate> *)
                                                  0x38d08d);
                                              lhs_00 = &pQVar10->nextNegotiatedProtocol;
                                              QSharedDataPointer<QSslConfigurationPrivate>::
                                              operator->((
                                                  QSharedDataPointer<QSslConfigurationPrivate> *)
                                                  0x38d0a5);
                                              bVar4 = ::operator==(lhs_00,(QByteArray *)
                                                                          CONCAT44(
                                                  in_stack_ffffffffffffff2c,
                                                  in_stack_ffffffffffffff28));
                                              local_31 = false;
                                              if (bVar4) {
                                                pQVar10 = 
                                                  QSharedDataPointer<QSslConfigurationPrivate>::
                                                  operator->((
                                                  QSharedDataPointer<QSslConfigurationPrivate> *)
                                                  0x38d0db);
                                                NVar11 = pQVar10->nextProtocolNegotiationStatus;
                                                pQVar10 = 
                                                  QSharedDataPointer<QSslConfigurationPrivate>::
                                                  operator->((
                                                  QSharedDataPointer<QSslConfigurationPrivate> *)
                                                  0x38d0f2);
                                                local_31 = false;
                                                if (NVar11 == pQVar10->nextProtocolNegotiationStatus
                                                   ) {
                                                  pQVar10 = 
                                                  QSharedDataPointer<QSslConfigurationPrivate>::
                                                  operator->((
                                                  QSharedDataPointer<QSslConfigurationPrivate> *)
                                                  0x38d11b);
                                                  uVar9 = (uint)(pQVar10->dtlsCookieEnabled & 1);
                                                  pQVar10 = 
                                                  QSharedDataPointer<QSslConfigurationPrivate>::
                                                  operator->((
                                                  QSharedDataPointer<QSslConfigurationPrivate> *)
                                                  0x38d137);
                                                  local_31 = false;
                                                  if (uVar9 == (pQVar10->dtlsCookieEnabled & 1)) {
                                                    pQVar10 = 
                                                  QSharedDataPointer<QSslConfigurationPrivate>::
                                                  operator->((
                                                  QSharedDataPointer<QSslConfigurationPrivate> *)
                                                  0x38d164);
                                                  uVar9 = (uint)(pQVar10->ocspStaplingEnabled & 1);
                                                  pQVar10 = 
                                                  QSharedDataPointer<QSslConfigurationPrivate>::
                                                  operator->((
                                                  QSharedDataPointer<QSslConfigurationPrivate> *)
                                                  0x38d180);
                                                  local_31 = false;
                                                  if (uVar9 == (pQVar10->ocspStaplingEnabled & 1)) {
                                                    pQVar10 = 
                                                  QSharedDataPointer<QSslConfigurationPrivate>::
                                                  operator->((
                                                  QSharedDataPointer<QSslConfigurationPrivate> *)
                                                  0x38d1ad);
                                                  uVar9 = (uint)(pQVar10->reportFromCallback & 1);
                                                  pQVar10 = 
                                                  QSharedDataPointer<QSslConfigurationPrivate>::
                                                  operator->((
                                                  QSharedDataPointer<QSslConfigurationPrivate> *)
                                                  0x38d1c9);
                                                  local_31 = false;
                                                  if (uVar9 == (pQVar10->reportFromCallback & 1)) {
                                                    pQVar10 = 
                                                  QSharedDataPointer<QSslConfigurationPrivate>::
                                                  operator->((
                                                  QSharedDataPointer<QSslConfigurationPrivate> *)
                                                  0x38d1f2);
                                                  uVar9 = (uint)(pQVar10->missingCertIsFatal & 1);
                                                  pQVar10 = 
                                                  QSharedDataPointer<QSslConfigurationPrivate>::
                                                  operator->((
                                                  QSharedDataPointer<QSslConfigurationPrivate> *)
                                                  0x38d20e);
                                                  local_31 = uVar9 == (pQVar10->missingCertIsFatal &
                                                                      1);
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    local_11 = local_31;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) {
    __stack_chk_fail();
  }
  return local_11;
}

Assistant:

bool QSslConfiguration::operator==(const QSslConfiguration &other) const
{
    if (d == other.d)
        return true;
    return d->peerCertificate == other.d->peerCertificate &&
        d->peerCertificateChain == other.d->peerCertificateChain &&
        d->localCertificateChain == other.d->localCertificateChain &&
        d->privateKey == other.d->privateKey &&
        d->sessionCipher == other.d->sessionCipher &&
        d->sessionProtocol == other.d->sessionProtocol &&
        d->preSharedKeyIdentityHint == other.d->preSharedKeyIdentityHint &&
        d->ciphers == other.d->ciphers &&
        d->ellipticCurves == other.d->ellipticCurves &&
        d->ephemeralServerKey == other.d->ephemeralServerKey &&
        d->dhParams == other.d->dhParams &&
        d->caCertificates == other.d->caCertificates &&
        d->protocol == other.d->protocol &&
        d->peerVerifyMode == other.d->peerVerifyMode &&
        d->peerVerifyDepth == other.d->peerVerifyDepth &&
        d->allowRootCertOnDemandLoading == other.d->allowRootCertOnDemandLoading &&
        d->backendConfig == other.d->backendConfig &&
        d->sslOptions == other.d->sslOptions &&
        d->sslSession == other.d->sslSession &&
        d->sslSessionTicketLifeTimeHint == other.d->sslSessionTicketLifeTimeHint &&
        d->nextAllowedProtocols == other.d->nextAllowedProtocols &&
        d->nextNegotiatedProtocol == other.d->nextNegotiatedProtocol &&
        d->nextProtocolNegotiationStatus == other.d->nextProtocolNegotiationStatus &&
        d->dtlsCookieEnabled == other.d->dtlsCookieEnabled &&
        d->ocspStaplingEnabled == other.d->ocspStaplingEnabled &&
        d->reportFromCallback == other.d->reportFromCallback &&
        d->missingCertIsFatal == other.d->missingCertIsFatal;
}